

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_2_named_unary_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = G->val[-3];
  if (pPVar1 == (PVIPNode *)0x0) {
    pPVar1 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_MY,pPVar1,G->val[-2]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_named_unary_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define i G->val[-1]
#define a G->val[-2]
#define type G->val[-3]
  yyprintf((stderr, "do yy_2_named_unary_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_MY, MAYBE(type), a); }\n"));
  yy = PVIP_node_new_children2(&(G->data), PVIP_NODE_MY, MAYBE(type), a); ;
#undef i
#undef a
#undef type
}